

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

MacroActualArgumentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroActualArgumentSyntax,std::span<slang::parsing::Token,18446744073709551615ul>>
          (BumpAllocator *this,span<slang::parsing::Token,_18446744073709551615UL> *args)

{
  pointer pTVar1;
  size_t sVar2;
  MacroActualArgumentSyntax *pMVar3;
  uint uStack_1c;
  
  pMVar3 = (MacroActualArgumentSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((MacroActualArgumentSyntax *)this->endPtr < pMVar3 + 1) {
    pMVar3 = (MacroActualArgumentSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pMVar3 + 1);
  }
  pTVar1 = args->_M_ptr;
  sVar2 = (args->_M_extent)._M_extent_value;
  (pMVar3->super_SyntaxNode).kind = MacroActualArgument;
  (pMVar3->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pMVar3->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pMVar3->tokens).super_SyntaxListBase.super_SyntaxNode.kind = TokenList;
  *(ulong *)&(pMVar3->tokens).super_SyntaxListBase.super_SyntaxNode.field_0x4 = (ulong)uStack_1c;
  *(undefined8 *)((long)&(pMVar3->tokens).super_SyntaxListBase.super_SyntaxNode.parent + 4) = 0;
  *(undefined4 *)((long)&(pMVar3->tokens).super_SyntaxListBase.super_SyntaxNode.previewNode + 4) = 0
  ;
  (pMVar3->tokens).super_SyntaxListBase.childCount = sVar2;
  (pMVar3->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr = pTVar1;
  (pMVar3->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pMVar3->tokens).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f7be8;
  (pMVar3->tokens).super_SyntaxListBase.super_SyntaxNode.parent = &pMVar3->super_SyntaxNode;
  return pMVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }